

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::type_to_enum_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_type *type)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [16];
  allocator local_25;
  t_base local_24;
  t_base_type *ptStack_20;
  t_base tbase;
  t_type *type_local;
  t_cpp_generator *this_local;
  
  ptStack_20 = (t_base_type *)type;
  type_local = (t_type *)this;
  this_local = (t_cpp_generator *)__return_storage_ptr__;
  ptStack_20 = (t_base_type *)t_generator::get_true_type(type);
  uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xb])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xc])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0x10])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xf])();
            if ((uVar1 & 1) == 0) {
              uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xe])();
              if ((uVar1 & 1) == 0) goto switchD_00209c91_default;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_LIST",
                         &local_40);
              std::allocator<char>::~allocator((allocator<char> *)&local_40);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_SET",
                         &local_3f);
              std::allocator<char>::~allocator((allocator<char> *)&local_3f);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_MAP",
                       &local_3e);
            std::allocator<char>::~allocator((allocator<char> *)&local_3e);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_STRUCT",
                     &local_3d);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_STRUCT",&local_3c
                  );
        std::allocator<char>::~allocator((allocator<char> *)&local_3c);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_I32",&local_3b);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    }
  }
  else {
    local_24 = t_base_type::get_base(ptStack_20);
    switch(local_24) {
    case TYPE_VOID:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "NO T_VOID CONSTRUCT";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    case TYPE_STRING:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_STRING",&local_25);
      std::allocator<char>::~allocator((allocator<char> *)&local_25);
      break;
    case TYPE_BOOL:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_BOOL",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
      break;
    case TYPE_I8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_BYTE",&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
      break;
    case TYPE_I16:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_I16",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
      break;
    case TYPE_I32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_I32",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
      break;
    case TYPE_I64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_I64",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      break;
    case TYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::apache::thrift::protocol::T_DOUBLE",&local_3a);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a);
      break;
    default:
switchD_00209c91_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar2 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar2));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::type_to_enum(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "NO T_VOID CONSTRUCT";
    case t_base_type::TYPE_STRING:
      return "::apache::thrift::protocol::T_STRING";
    case t_base_type::TYPE_BOOL:
      return "::apache::thrift::protocol::T_BOOL";
    case t_base_type::TYPE_I8:
      return "::apache::thrift::protocol::T_BYTE";
    case t_base_type::TYPE_I16:
      return "::apache::thrift::protocol::T_I16";
    case t_base_type::TYPE_I32:
      return "::apache::thrift::protocol::T_I32";
    case t_base_type::TYPE_I64:
      return "::apache::thrift::protocol::T_I64";
    case t_base_type::TYPE_DOUBLE:
      return "::apache::thrift::protocol::T_DOUBLE";
    }
  } else if (type->is_enum()) {
    return "::apache::thrift::protocol::T_I32";
  } else if (type->is_struct()) {
    return "::apache::thrift::protocol::T_STRUCT";
  } else if (type->is_xception()) {
    return "::apache::thrift::protocol::T_STRUCT";
  } else if (type->is_map()) {
    return "::apache::thrift::protocol::T_MAP";
  } else if (type->is_set()) {
    return "::apache::thrift::protocol::T_SET";
  } else if (type->is_list()) {
    return "::apache::thrift::protocol::T_LIST";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}